

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O0

bool __thiscall cmDocumentation::PrintHelpOneManual(cmDocumentation *this,ostream *os)

{
  undefined8 uVar1;
  bool bVar2;
  char *pcVar3;
  ostream *poVar4;
  bool local_12a;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  ulong local_48;
  size_type mlen;
  string mname;
  ostream *os_local;
  cmDocumentation *this_local;
  
  mname.field_2._8_8_ = os;
  std::__cxx11::string::string((string *)&mlen,(string *)&this->CurrentArgument);
  local_48 = std::__cxx11::string::length();
  if (((3 < local_48) &&
      (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&mlen), *pcVar3 == '(')) &&
     (pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&mlen), *pcVar3 == ')')) {
    std::__cxx11::string::substr((ulong)&local_b8,(ulong)&mlen);
    std::operator+(&local_98,&local_b8,".");
    pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)&mlen);
    std::operator+(&local_78,&local_98,*pcVar3);
    std::__cxx11::string::operator=((string *)&mlen,(string *)&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  uVar1 = mname.field_2._8_8_;
  cmStrCat<char_const(&)[8],std::__cxx11::string&>
            (&local_d8,(char (*) [8])"manual/",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mlen);
  bVar2 = PrintFiles(this,(ostream *)uVar1,&local_d8);
  uVar1 = mname.field_2._8_8_;
  local_12a = true;
  if (!bVar2) {
    cmStrCat<char_const(&)[8],std::__cxx11::string&,char_const(&)[7]>
              (&local_f8,(char (*) [8])"manual/",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mlen,
               (char (*) [7])".[0-9]");
    local_12a = PrintFiles(this,(ostream *)uVar1,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  std::__cxx11::string::~string((string *)&local_d8);
  if (local_12a == false) {
    poVar4 = std::operator<<((ostream *)mname.field_2._8_8_,"Argument \"");
    poVar4 = std::operator<<(poVar4,(string *)&this->CurrentArgument);
    std::operator<<(poVar4,
                    "\" to --help-manual is not an available manual.  Use --help-manual-list to see all available manuals.\n"
                   );
  }
  std::__cxx11::string::~string((string *)&mlen);
  return local_12a != false;
}

Assistant:

bool cmDocumentation::PrintHelpOneManual(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  std::string::size_type mlen = mname.length();
  if (mlen > 3 && mname[mlen - 3] == '(' && mname[mlen - 1] == ')') {
    mname = mname.substr(0, mlen - 3) + "." + mname[mlen - 2];
  }
  if (this->PrintFiles(os, cmStrCat("manual/", mname)) ||
      this->PrintFiles(os, cmStrCat("manual/", mname, ".[0-9]"))) {
    return true;
  }
  // Argument was not a manual.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-manual is not an available manual.  "
        "Use --help-manual-list to see all available manuals.\n";
  return false;
}